

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall HFSubConsumer::~HFSubConsumer(HFSubConsumer *this)

{
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  __pointer_type pPVar1;
  __int_type _Var2;
  __int_type _Var3;
  __pointer_type pPVar4;
  pointer pcVar5;
  ConcurrentQueueProducerTypelessBase *pCVar6;
  bool bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  zframe_t *frame;
  zframe_t *local_38;
  
  (this->super_HighFreqSub)._vptr_HighFreqSub = (_func_int **)&PTR__HFSubConsumer_003ed8f8;
  if (this->req != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->req,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0xa3);
  }
  this_00 = &this->framequeue;
  uVar11 = 0;
  while( true ) {
    pPVar1 = (this_00->producerListTail)._M_b._M_p;
    uVar9 = 0;
    pPVar4 = pPVar1;
    while (pPVar4 != (__pointer_type)0x0) {
      _Var2 = (pPVar1->tailIndex).super___atomic_base<unsigned_long>._M_i;
      _Var3 = (pPVar1->headIndex).super___atomic_base<unsigned_long>._M_i;
      lVar10 = _Var2 - _Var3;
      if (_Var3 - _Var2 < 0x8000000000000001) {
        lVar10 = 0;
      }
      uVar9 = uVar9 + lVar10;
      pPVar4 = (__pointer_type)(pPVar1->super_ConcurrentQueueProducerTypelessBase).next;
      pPVar1 = (__pointer_type)&pPVar4[-1].parent;
    }
    if (uVar9 <= uVar11) break;
    bVar7 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                      ((ConcurrentQueue<_zframe_t*,MyTraits> *)this_00,&this->consumetoken,&local_38
                      );
    if (bVar7) {
      zframe_destroy(&local_38);
    }
    uVar11 = uVar11 + 1;
  }
  pcVar5 = (this->rependpoint)._M_dataplus._M_p;
  paVar8 = &(this->rependpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar8) {
    operator_delete(pcVar5,paVar8->_M_allocated_capacity + 1);
  }
  pCVar6 = (this->ptoken).producer;
  if (pCVar6 != (ConcurrentQueueProducerTypelessBase *)0x0) {
    pCVar6->token = (ProducerToken *)0x0;
    (pCVar6->inactive)._M_base._M_i = true;
  }
  moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::~ConcurrentQueue(this_00);
  HighFreqSub::~HighFreqSub(&this->super_HighFreqSub);
  return;
}

Assistant:

HFSubConsumer::~HFSubConsumer(){
    if(req)
        zsock_destroy(&req);
    for(size_t i = 0; i < framequeue.size_approx(); i++){
        zframe_t* frame;
        if(framequeue.try_dequeue(consumetoken,frame))
            zframe_destroy(&frame);
    }
}